

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_3d.cpp
# Opt level: O1

size_t prediction_and_quantization_3d<float>
                 (float *data,DSize_3d *size,meanInfo<float> *mean_info,double precision,
                 int capacity,int intv_radius,uchar *indicator,int *type,int *reg_params_type,
                 float **reg_unpredictable_data_pos,float **unpredictable_data_pos)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  int size_x;
  int size_y;
  int size_z;
  uchar uVar6;
  int i;
  undefined8 *__ptr;
  long lVar7;
  void *__s;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  int iVar21;
  long lVar22;
  size_t __size;
  float *reg_params_pos;
  ulong uVar23;
  long lVar24;
  float fVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  float fVar29;
  float fVar30;
  double reg_precisions [4];
  size_t local_150;
  float *local_140;
  ulong local_130;
  ulong local_128;
  float *local_110;
  double adStack_58 [5];
  
  __ptr = (undefined8 *)malloc(size->num_blocks * 0x10 + 0x10);
  *__ptr = 0;
  __ptr[1] = 0;
  fVar25 = (float)(precision * 0.1 * 0.25);
  dVar26 = (double)(fVar25 / (float)size->block_size);
  lVar7 = 0;
  auVar27 = _DAT_0010a070;
  do {
    if (SUB164(auVar27 ^ _DAT_0010a020,4) == DAT_0010a080._4_4_ &&
        SUB164(auVar27 ^ _DAT_0010a020,0) < (int)DAT_0010a080) {
      adStack_58[lVar7] = dVar26;
      adStack_58[lVar7 + 1] = dVar26;
    }
    lVar7 = lVar7 + 2;
    lVar22 = auVar27._8_8_;
    auVar27._0_8_ = auVar27._0_8_ + 2;
    auVar27._8_8_ = lVar22 + 2;
  } while (lVar7 != 4);
  adStack_58[3] = (double)fVar25;
  lVar22 = (long)size->block_size;
  lVar7 = lVar22 + 1;
  iVar10 = (int)lVar7;
  uVar23 = (ulong)(uint)(iVar10 * iVar10);
  __size = (long)(iVar10 * iVar10 * iVar10) << 2;
  __s = malloc(__size);
  memset(__s,0,__size);
  if (size->num_x == 0) {
    local_150 = 0;
  }
  else {
    reg_params_pos = (float *)(__ptr + 2);
    iVar10 = capacity + -2;
    if (mean_info->use_mean == false) {
      iVar10 = capacity;
    }
    lVar2 = lVar22 * 4 + 4;
    local_130 = 0;
    local_150 = 0;
    do {
      if (size->num_y != 0) {
        local_128 = 0;
        local_110 = data;
        do {
          if (size->num_z != 0) {
            local_140 = local_110;
            uVar8 = 0;
            do {
              iVar17 = size->block_size;
              lVar12 = (long)iVar17;
              size_x = (int)size->d1 - (int)local_130 * iVar17;
              if ((local_130 + 1) * lVar12 < size->d1) {
                size_x = iVar17;
              }
              size_y = (int)size->d2 - (int)local_128 * iVar17;
              if ((local_128 + 1) * lVar12 < size->d2) {
                size_y = iVar17;
              }
              uVar1 = uVar8 + 1;
              size_z = (int)size->d3 - (int)uVar8 * iVar17;
              if (lVar12 * uVar1 < size->d3) {
                size_z = iVar17;
              }
              iVar17 = size_y;
              if (size_x < size_y) {
                iVar17 = size_x;
              }
              if (size_z <= iVar17) {
                iVar17 = size_z;
              }
              if (iVar17 < 4) {
                uVar6 = '\0';
              }
              else {
                compute_regression_coeffcients_3d<float>
                          (local_140,size_x,size_y,size_z,size->dim0_offset,size->dim1_offset,
                           reg_params_pos);
                iVar17 = sz_blockwise_selection_3d<float>
                                   (local_140,mean_info,size->dim0_offset,size->dim1_offset,iVar17,
                                    (float)(precision * 1.22),reg_params_pos);
                uVar6 = (uchar)iVar17;
              }
              *indicator = uVar6;
              lVar12 = (long)size_z;
              if (uVar6 == '\0') {
                if (0 < size_x) {
                  sVar4 = size->dim0_offset;
                  sVar5 = size->dim1_offset;
                  iVar17 = 0;
                  pfVar18 = local_140;
                  lVar9 = (long)__s + lVar7 * 4 + uVar23 * 4 + 4;
                  do {
                    if (0 < size_y) {
                      bVar3 = mean_info->use_mean;
                      lVar24 = lVar9 + ~(lVar22 + uVar23) * 4;
                      lVar13 = lVar9 + uVar23 * -4;
                      lVar16 = lVar9 + (lVar22 * 4 ^ 0xfffffffffffffffcU);
                      iVar11 = 0;
                      pfVar19 = *unpredictable_data_pos;
                      do {
                        pfVar20 = pfVar19;
                        if (0 < size_z) {
                          lVar14 = 0;
                          iVar21 = size_z;
                          do {
                            if (((bVar3 & 1U) == 0) ||
                               (fVar25 = mean_info->mean,
                               precision <= (double)ABS(*(float *)((long)pfVar18 + lVar14) - fVar25)
                               )) {
                              fVar29 = ((((*(float *)(lVar9 + -4 + lVar14) +
                                           *(float *)(lVar16 + lVar14) + *(float *)(lVar13 + lVar14)
                                          ) - *(float *)(lVar16 + -4 + lVar14)) -
                                        *(float *)(lVar13 + -4 + lVar14)) -
                                       *(float *)(lVar24 + lVar14)) +
                                       *(float *)(lVar24 + -4 + lVar14);
                              fVar25 = *(float *)((long)pfVar18 + lVar14);
                              fVar30 = fVar25 - fVar29;
                              dVar26 = (double)ABS(fVar30) / precision + 1.0;
                              if ((double)iVar10 <= dVar26) {
LAB_00104759:
                                *(float *)(lVar9 + lVar14) = fVar25;
                                pfVar20 = pfVar19 + 1;
                                *unpredictable_data_pos = pfVar20;
                                *pfVar19 = fVar25;
                                iVar15 = 0;
                                pfVar19 = pfVar20;
                              }
                              else {
                                if (fVar30 <= 0.0) {
                                  dVar26 = -dVar26;
                                }
                                fVar29 = (float)((double)((int)(dVar26 * 0.5) * 2) * precision +
                                                (double)fVar29);
                                *(float *)(lVar9 + lVar14) = fVar29;
                                if (precision < (double)ABS(fVar29 - fVar25)) goto LAB_00104759;
                                iVar15 = (int)(dVar26 * 0.5) + intv_radius;
                              }
                              *(int *)((long)type + lVar14) = iVar15;
                            }
                            else {
                              *(undefined4 *)((long)type + lVar14) = 1;
                              *(float *)(lVar9 + lVar14) = fVar25;
                            }
                            lVar14 = lVar14 + 4;
                            iVar21 = iVar21 + -1;
                          } while (iVar21 != 0);
                          type = (int *)((long)type + lVar14);
                          pfVar18 = (float *)((long)pfVar18 + lVar14);
                        }
                        lVar9 = lVar9 + lVar2;
                        pfVar18 = pfVar18 + (sVar5 - lVar12);
                        iVar11 = iVar11 + 1;
                        lVar24 = lVar24 + lVar2;
                        lVar13 = lVar13 + lVar2;
                        lVar16 = lVar16 + lVar2;
                        pfVar19 = pfVar20;
                      } while (iVar11 != size_y);
                    }
                    lVar9 = lVar9 + (uVar23 - size_y * lVar7) * 4;
                    pfVar18 = pfVar18 + (sVar4 - sVar5 * (long)size_y);
                    iVar17 = iVar17 + 1;
                  } while (iVar17 != size_x);
                }
              }
              else {
                pfVar18 = *reg_unpredictable_data_pos;
                lVar9 = 0;
                do {
                  fVar25 = reg_params_pos[lVar9];
                  dVar26 = adStack_58[lVar9];
                  fVar29 = fVar25 - reg_params_pos[lVar9 + -4];
                  dVar28 = (double)ABS(fVar29) / dVar26 + 1.0;
                  if (65536.0 <= dVar28) {
LAB_001043f9:
                    reg_params_pos[lVar9] = fVar25;
                    *reg_unpredictable_data_pos = pfVar18 + 1;
                    *pfVar18 = fVar25;
                    iVar17 = 0;
                    pfVar18 = pfVar18 + 1;
                  }
                  else {
                    if (fVar29 <= 0.0) {
                      dVar28 = -dVar28;
                    }
                    fVar29 = (float)((double)((int)(dVar28 * 0.5) * 2) * dVar26 +
                                    (double)reg_params_pos[lVar9 + -4]);
                    reg_params_pos[lVar9] = fVar29;
                    if (dVar26 < (double)ABS(fVar29 - fVar25)) goto LAB_001043f9;
                    iVar17 = (int)(dVar28 * 0.5) + 0x8000;
                  }
                  reg_params_type[lVar9] = iVar17;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 4);
                if (0 < size_x) {
                  sVar4 = size->dim0_offset;
                  sVar5 = size->dim1_offset;
                  pfVar18 = *unpredictable_data_pos;
                  iVar17 = 0;
                  pfVar19 = local_140;
                  do {
                    if (0 < size_y) {
                      iVar11 = 0;
                      pfVar20 = pfVar18;
                      do {
                        if (0 < size_z) {
                          lVar9 = 0;
                          lVar24 = 0;
                          do {
                            fVar29 = (float)(int)lVar24 * reg_params_pos[2] +
                                     *reg_params_pos * (float)iVar17 +
                                     reg_params_pos[1] * (float)iVar11 + reg_params_pos[3];
                            fVar25 = pfVar19[lVar24];
                            fVar30 = fVar25 - fVar29;
                            dVar26 = (double)ABS(fVar30) / precision + 1.0;
                            if ((double)capacity <= dVar26) {
LAB_00104530:
                              pfVar18 = pfVar20 + 1;
                              *unpredictable_data_pos = pfVar18;
                              *pfVar20 = fVar25;
                              iVar21 = 0;
                              pfVar20 = pfVar18;
                            }
                            else {
                              if (fVar30 <= 0.0) {
                                dVar26 = -dVar26;
                              }
                              if (precision <
                                  (double)ABS((float)((double)((int)(dVar26 * 0.5) * 2) * precision
                                                     + (double)fVar29) - fVar25)) goto LAB_00104530;
                              iVar21 = (int)(dVar26 * 0.5) + intv_radius;
                            }
                            type[lVar24] = iVar21;
                            lVar24 = lVar24 + 1;
                            lVar9 = lVar9 + -4;
                          } while (size_z != (int)lVar24);
                          type = (int *)((long)type - lVar9);
                          pfVar19 = (float *)((long)pfVar19 - lVar9);
                        }
                        pfVar19 = pfVar19 + (sVar5 - lVar12);
                        iVar11 = iVar11 + 1;
                      } while (iVar11 != size_y);
                    }
                    pfVar19 = pfVar19 + (sVar4 - (long)size_y * sVar5);
                    iVar17 = iVar17 + 1;
                  } while (iVar17 != size_x);
                }
                local_150 = local_150 + 1;
                reg_params_pos = reg_params_pos + 4;
                reg_params_type = reg_params_type + 4;
              }
              indicator = indicator + 1;
              local_140 = local_140 + lVar12;
              uVar8 = uVar1;
            } while (uVar1 < size->num_z);
          }
          local_110 = local_110 + (long)size->block_size * size->dim1_offset;
          local_128 = local_128 + 1;
        } while (local_128 < size->num_y);
      }
      data = data + (long)size->block_size * size->dim0_offset;
      local_130 = local_130 + 1;
    } while (local_130 < size->num_x);
  }
  free(__s);
  free(__ptr);
  return local_150;
}

Assistant:

size_t
prediction_and_quantization_3d(const T * data, const DSize_3d& size, const meanInfo<T>& mean_info, double precision,
	int capacity, int intv_radius, unsigned char * indicator, int * type, 
	int * reg_params_type, float *& reg_unpredictable_data_pos, T *& unpredictable_data_pos){
	const float noise = precision * LorenzeNoise3d;
	int * type_pos = type;
	unsigned char * indicator_pos = indicator;
	float * reg_params = (float *) malloc(RegCoeffNum3d * (size.num_blocks+1) * sizeof(float));
	for(int i=0; i<RegCoeffNum3d; i++)
		reg_params[i] = 0;
	float * reg_params_pos = reg_params + RegCoeffNum3d;
	int * reg_params_type_pos = reg_params_type;
	double reg_precisions[RegCoeffNum3d];
	float rel_param_err = RegErrThreshold * precision / RegCoeffNum3d;
	for(int i=0; i<RegCoeffNum3d-1; i++) 
		reg_precisions[i] = rel_param_err / size.block_size;
	reg_precisions[RegCoeffNum3d - 1] = rel_param_err;
	size_t buffer_dim0_offset = (size.block_size + 1) * (size.block_size + 1);
	size_t buffer_dim1_offset = size.block_size + 1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.block_size+1)*(size.block_size+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.block_size+1)*(size.block_size+1)*sizeof(T));
	size_t reg_count = 0;
	int capacity_lorenzo = mean_info.use_mean ? capacity - 2 : capacity;
	const T * x_data_pos = data;
	for(size_t i=0; i<size.num_x; i++){
		const T * y_data_pos = x_data_pos;
		for(size_t j=0; j<size.num_y; j++){
			const T * z_data_pos = y_data_pos;
			for(size_t k=0; k<size.num_z; k++){
				int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
				int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
				int size_z = ((k+1)*size.block_size < size.d3) ? size.block_size : size.d3 - k*size.block_size;
				int min_size = MIN(size_x, size_y);
				min_size = MIN(min_size, size_z);
				// size of block is less than some threshold
				if(min_size < RegThresholdSize3d){
					*indicator_pos = 0;
				}
				else{
					compute_regression_coeffcients_3d(z_data_pos, size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, reg_params_pos);
					*indicator_pos = sz_blockwise_selection_3d(z_data_pos, mean_info, size.dim0_offset, size.dim1_offset, min_size, noise, reg_params_pos);
				}
				if(*indicator_pos){
					// regression
					compress_regression_coefficient_3d(reg_precisions, reg_params_pos, reg_params_type_pos, reg_unpredictable_data_pos);
					block_pred_and_quant_regression_3d(z_data_pos, reg_params_pos, precision, capacity, intv_radius, 
						size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
					reg_count ++;
					reg_params_pos += RegCoeffNum3d;
					reg_params_type_pos += RegCoeffNum3d;
				}
				else{
					// Lorenzo
					block_pred_and_quant_lorenzo_3d(mean_info, z_data_pos, pred_buffer, precision, capacity_lorenzo, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
				}
				indicator_pos ++;
				z_data_pos += size_z;
			}
			y_data_pos += size.block_size*size.dim1_offset;
		}
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
	free(reg_params);
	return reg_count;
}